

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O0

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,void*,char_const*>,0ul,1ul,2ul>
               (ostream *os,tuple<const_char_*,_void_*,_const_char_*> *t)

{
  __tuple_element_t<0UL,_tuple<const_char_*,_void_*,_const_char_*>_> *ppcVar1;
  __tuple_element_t<1UL,_tuple<const_char_*,_void_*,_const_char_*>_> *ppvVar2;
  __tuple_element_t<2UL,_tuple<const_char_*,_void_*,_const_char_*>_> *ppcVar3;
  tuple<const_char_*,_void_*,_const_char_*> *t_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  ppcVar1 = std::get<0ul,char_const*,void*,char_const*>(t);
  std::operator<<(os,*ppcVar1);
  ppvVar2 = std::get<1ul,char_const*,void*,char_const*>(t);
  std::ostream::operator<<(os,*ppvVar2);
  ppcVar3 = std::get<2ul,char_const*,void*,char_const*>(t);
  std::operator<<(os,*ppcVar3);
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}